

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::AsyncStreamFd::~AsyncStreamFd(AsyncStreamFd *this)

{
  AsyncStreamFd *this_local;
  
  ~AsyncStreamFd(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

virtual ~AsyncStreamFd() noexcept(false) {}